

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers
          (BuildSystemFrontendDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  pointer ppCVar1;
  Command *pCVar2;
  StringRef Str;
  StringRef Str_00;
  raw_ostream *prVar3;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *__range1;
  pointer ppCVar4;
  string message;
  raw_string_ostream messageStream;
  
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  messageStream.super_raw_ostream.BufferMode = InternalBuffer;
  messageStream.super_raw_ostream.OutBufStart = (char *)0x0;
  messageStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  messageStream.super_raw_ostream.OutBufCur = (char *)0x0;
  messageStream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_string_ostream_0023ea78;
  messageStream.OS = &message;
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,"unable to build node: \'");
  Str.Data = (output->name)._M_dataplus._M_p;
  Str.Length = (output->name)._M_string_length;
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str);
  llvm::raw_ostream::operator<<
            (&messageStream.super_raw_ostream,"\' (node is produced by multiple commands: \'");
  ppCVar1 = (commands->
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar4 = (commands->
                 super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
      ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    if (pCVar2 != *(commands->
                   super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                   )._M_impl.super__Vector_impl_data._M_start) {
      llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,", ");
    }
    prVar3 = llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,"\'");
    Str_00.Data = (pCVar2->name)._M_dataplus._M_p;
    Str_00.Length = (pCVar2->name)._M_string_length;
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_00);
    llvm::raw_ostream::operator<<(prVar3,"\'");
  }
  llvm::raw_ostream::flush(&messageStream.super_raw_ostream);
  fwrite(message._M_dataplus._M_p,message._M_string_length,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream(&messageStream);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers(
     Node *output, std::vector<Command*> commands) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "unable to build node: '";
  messageStream << output->getName();
  messageStream << "' (node is produced by multiple commands: '";

  for (Command* cmd : commands) {
    if (cmd != *commands.begin()) {
      messageStream << ", ";
    }
    messageStream << "'" << cmd->getName() << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}